

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# markdownhighlighter.cpp
# Opt level: O0

void __thiscall MarkdownHighlighter::highlightCommentBlock(MarkdownHighlighter *this,QString *text)

{
  qsizetype *this_00;
  QString *pQVar1;
  byte bVar2;
  bool bVar3;
  int iVar4;
  ulong uVar5;
  bool local_12d;
  bool local_126;
  bool local_120;
  bool local_11e;
  HighlighterState local_fc;
  bool local_f7;
  bool local_f6;
  bool local_f5;
  undefined4 local_f4;
  undefined1 local_f0;
  bool highlight;
  bool isCommentEnd;
  bool isComment;
  undefined1 local_d8 [8];
  QString endText;
  QArrayDataPointer<char16_t> local_b0;
  undefined1 local_98 [8];
  QString startText;
  QString *trimmedText;
  QLatin1String local_58;
  QString *local_48;
  QString *text_local;
  MarkdownHighlighter *this_local;
  char16_t *str_1;
  undefined1 *local_28;
  char16_t *local_20;
  char16_t *str;
  QArrayDataPointer<char16_t> *local_10;
  
  local_48 = text;
  text_local = (QString *)this;
  QLatin1String::QLatin1String(&local_58,"    ");
  uVar5 = QString::startsWith((QLatin1String *)text,(CaseSensitivity)local_58.m_size);
  pQVar1 = local_48;
  if ((uVar5 & 1) == 0) {
    QLatin1Char::QLatin1Char((QLatin1Char *)((long)&trimmedText + 5),'\t');
    QChar::QChar((QChar *)((long)&trimmedText + 6),trimmedText._5_1_);
    uVar5 = QString::startsWith((QChar *)pQVar1,(uint)trimmedText._6_2_);
    if ((uVar5 & 1) == 0) {
      QString::trimmed((QString *)&startText.d.size,local_48);
      this_00 = &startText.d.size;
      local_10 = &local_b0;
      str = L"<!--";
      local_20 = L"<!--";
      QArrayDataPointer<char16_t>::QArrayDataPointer(&local_b0,(Data *)0x0,L"<!--",4);
      QString::QString((QString *)local_98,&local_b0);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_b0);
      local_28 = &local_f0;
      str_1 = L"-->";
      this_local = (MarkdownHighlighter *)anon_var_dwarf_987f3;
      QArrayDataPointer<char16_t>::QArrayDataPointer
                ((QArrayDataPointer<char16_t> *)&local_f0,(Data *)0x0,L"-->",3);
      QString::QString((QString *)local_d8,(DataPointer *)&local_f0);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_f0);
      bVar2 = QString::startsWith((QString *)this_00,(CaseSensitivity)local_98);
      if (((bVar2 & 1) == 0) ||
         (bVar3 = QString::contains((QString *)this_00,(QString *)local_d8,CaseSensitive), !bVar3))
      {
        bVar2 = QString::startsWith((QString *)this_00,(CaseSensitivity)local_98);
        if (((bVar2 & 1) == 0) &&
           (bVar3 = QString::contains((QString *)this_00,(QString *)local_98,CaseSensitive), bVar3))
        {
          local_f4 = 1;
        }
        else {
          bVar2 = QString::startsWith((QString *)this_00,(CaseSensitivity)local_98);
          local_11e = true;
          if ((bVar2 & 1) == 0) {
            bVar2 = QString::endsWith((QString *)this_00,(CaseSensitivity)local_d8);
            local_120 = false;
            if ((bVar2 & 1) == 0) {
              iVar4 = QSyntaxHighlighter::previousBlockState();
              local_120 = iVar4 == 0xb;
            }
            local_11e = local_120;
          }
          local_f5 = local_11e;
          bVar2 = QString::endsWith((QString *)this_00,(CaseSensitivity)local_d8);
          local_126 = false;
          if ((bVar2 & 1) != 0) {
            iVar4 = QSyntaxHighlighter::previousBlockState();
            local_126 = iVar4 == 0xb;
          }
          local_f6 = local_126;
          local_12d = true;
          if ((local_f5 & 1U) == 0) {
            local_12d = local_126;
          }
          local_f7 = local_12d;
          if ((local_f5 & 1U) != 0) {
            QSyntaxHighlighter::setCurrentBlockState((int)this);
          }
          if ((local_f7 & 1U) != 0) {
            uVar5 = QString::length(local_48);
            local_fc = Comment;
            QHash<MarkdownHighlighter::HighlighterState,_QTextCharFormat>::operator[]
                      (&_formats,&local_fc);
            QSyntaxHighlighter::setFormat((int)this,0,(QTextCharFormat *)(uVar5 & 0xffffffff));
          }
          local_f4 = 0;
        }
      }
      else {
        local_f4 = 1;
      }
      QString::~QString((QString *)local_d8);
      QString::~QString((QString *)local_98);
      QString::~QString((QString *)&startText.d.size);
    }
  }
  return;
}

Assistant:

void MarkdownHighlighter::highlightCommentBlock(const QString &text) {
    if (text.startsWith(QLatin1String("    ")) ||
        text.startsWith(QLatin1Char('\t')))
        return;

    const QString &trimmedText = text.trimmed();
    const QString startText(QStringLiteral("<!--"));
    const QString endText(QStringLiteral("-->"));

    // we will skip this case because that is an inline comment and causes
    // troubles here
    if (trimmedText.startsWith(startText) && trimmedText.contains(endText)) {
        return;
    }

    if (!trimmedText.startsWith(startText) && trimmedText.contains(startText))
        return;

    const bool isComment =
        trimmedText.startsWith(startText) ||
        (!trimmedText.endsWith(endText) && previousBlockState() == Comment);
    const bool isCommentEnd =
        trimmedText.endsWith(endText) && previousBlockState() == Comment;
    const bool highlight = isComment || isCommentEnd;

    if (isComment) setCurrentBlockState(Comment);
    if (highlight) setFormat(0, text.length(), _formats[Comment]);
}